

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiListClipperRange>::push_back
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  ImGuiListClipperRange *pIVar1;
  ImGuiListClipperRange *pIVar2;
  ImS8 IVar3;
  ImS8 IVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  int new_capacity;
  
  iVar7 = this->Size;
  if (iVar7 == this->Capacity) {
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    new_capacity = iVar7 + 1;
    if (iVar7 + 1 < iVar6) {
      new_capacity = iVar6;
    }
    reserve(this,new_capacity);
    iVar7 = this->Size;
  }
  pIVar1 = this->Data;
  IVar3 = v->PosToIndexOffsetMin;
  IVar4 = v->PosToIndexOffsetMax;
  uVar5 = v->field_0xb;
  pIVar2 = pIVar1 + iVar7;
  pIVar2->PosToIndexConvert = v->PosToIndexConvert;
  pIVar2->PosToIndexOffsetMin = IVar3;
  pIVar2->PosToIndexOffsetMax = IVar4;
  pIVar2->field_0xb = uVar5;
  iVar6 = v->Max;
  pIVar1 = pIVar1 + iVar7;
  pIVar1->Min = v->Min;
  pIVar1->Max = iVar6;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }